

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int I420Rect(uint8_t *dst_y,int dst_stride_y,uint8_t *dst_u,int dst_stride_u,uint8_t *dst_v,
            int dst_stride_v,int x,int y,int width,int height,int value_y,int value_u,int value_v)

{
  long lVar1;
  uint8_t *dst_y_00;
  int in_ECX;
  long in_RDX;
  long in_RDI;
  long in_R8;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  uint8_t *start_v;
  uint8_t *start_u;
  uint8_t *start_y;
  int in_stack_00000038;
  int halfheight;
  int halfwidth;
  undefined4 local_4;
  
  lVar1 = in_RDX + (in_stack_00000010 / 2) * in_ECX;
  dst_y_00 = (uint8_t *)(in_R8 + (in_stack_00000010 / 2) * in_R9D);
  if (((((in_RDI == 0) || (in_RDX == 0)) || (in_R8 == 0)) ||
      (((in_stack_00000018 < 1 || ((int)start_v == 0)) ||
       ((in_stack_00000008 < 0 || ((in_stack_00000010 < 0 || ((int)start_u < 0)))))))) ||
     ((0xff < (int)start_u ||
      (((((int)start_y < 0 || (0xff < (int)start_y)) || (in_stack_00000038 < 0)) ||
       (0xff < in_stack_00000038)))))) {
    local_4 = -1;
  }
  else {
    SetPlane(dst_y_00,(int)((ulong)in_R8 >> 0x20),(int)in_R8,(int)((ulong)lVar1 >> 0x20),
             (uint32_t)lVar1);
    SetPlane(dst_y_00,(int)((ulong)in_R8 >> 0x20),(int)in_R8,(int)((ulong)lVar1 >> 0x20),
             (uint32_t)lVar1);
    SetPlane(dst_y_00,(int)((ulong)in_R8 >> 0x20),(int)in_R8,(int)((ulong)lVar1 >> 0x20),
             (uint32_t)lVar1);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int I420Rect(uint8_t* dst_y,
             int dst_stride_y,
             uint8_t* dst_u,
             int dst_stride_u,
             uint8_t* dst_v,
             int dst_stride_v,
             int x,
             int y,
             int width,
             int height,
             int value_y,
             int value_u,
             int value_v) {
  int halfwidth = (width + 1) >> 1;
  int halfheight = (height + 1) >> 1;
  uint8_t* start_y = dst_y + y * dst_stride_y + x;
  uint8_t* start_u = dst_u + (y / 2) * dst_stride_u + (x / 2);
  uint8_t* start_v = dst_v + (y / 2) * dst_stride_v + (x / 2);
  if (!dst_y || !dst_u || !dst_v || width <= 0 || height == 0 || x < 0 ||
      y < 0 || value_y < 0 || value_y > 255 || value_u < 0 || value_u > 255 ||
      value_v < 0 || value_v > 255) {
    return -1;
  }

  SetPlane(start_y, dst_stride_y, width, height, value_y);
  SetPlane(start_u, dst_stride_u, halfwidth, halfheight, value_u);
  SetPlane(start_v, dst_stride_v, halfwidth, halfheight, value_v);
  return 0;
}